

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__png_info_raw(stbi__png *p,int *x,int *y,int *comp)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long *in_RDI;
  int in_stack_00000440;
  int in_stack_00000444;
  stbi__png *in_stack_00000448;
  undefined4 local_4;
  
  iVar1 = stbi__parse_png_file(in_stack_00000448,in_stack_00000444,in_stack_00000440);
  if (iVar1 == 0) {
    stbi__rewind((stbi__context *)*in_RDI);
    local_4 = 0;
  }
  else {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = *(undefined4 *)*in_RDI;
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = *(undefined4 *)(*in_RDI + 4);
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = *(undefined4 *)(*in_RDI + 8);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__png_info_raw(stbi__png *p, int *x, int *y, int *comp) {
    if (!stbi__parse_png_file(p, STBI__SCAN_header, 0)) {
        stbi__rewind(p->s);
        return 0;
    }
    if (x) *x = p->s->img_x;
    if (y) *y = p->s->img_y;
    if (comp) *comp = p->s->img_n;
    return 1;
}